

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O0

Lazy<bool> __thiscall coro_io::period_timer::async_await(period_timer *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 *extraout_RAX;
  callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:295:45)>
  *this_00;
  undefined8 in_RSI;
  LazyBase<bool,_false> in_RDI;
  callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:295:45)>
  cVar4;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  
  puVar3 = (undefined8 *)operator_new(0x80,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<bool>::get_return_object_on_allocation_failure();
  }
  else {
    *puVar3 = async_await;
    puVar3[1] = async_await;
    this_00 = (callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:295:45)>
               *)(puVar3 + 9);
    puVar3[0xe] = in_RSI;
    async_simple::coro::detail::LazyPromise<bool>::LazyPromise
              ((LazyPromise<bool> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    async_simple::coro::detail::LazyPromise<bool>::get_return_object
              ((LazyPromise<bool> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar3 + 2));
    bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x79));
    if (bVar2) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x79));
      uVar1 = puVar3[0xe];
      callback_awaitor<bool>::callback_awaitor((callback_awaitor<bool> *)0x163fe8);
      puVar3[0xd] = uVar1;
      cVar4 = callback_awaitor_base<bool,coro_io::callback_awaitor<bool>>::
              await_resume<coro_io::period_timer::async_await()::_lambda(auto:1)_1_>
                        ((callback_awaitor_base<bool,_coro_io::callback_awaitor<bool>_> *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (anon_class_8_1_8991fb9c *)
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      *(callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:295:45)>
        *)(puVar3 + 0xb) = cVar4;
      cVar4 = async_simple::coro::detail::LazyPromiseBase::
              await_transform<coro_io::callback_awaitor_base<bool,coro_io::callback_awaitor<bool>>::callback_awaitor_impl<coro_io::period_timer::async_await()::_lambda(auto:1)_1_>>
                        ((LazyPromiseBase *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_ylt_coro_io_coro_io_hpp:295:45)>
                          *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      *this_00 = cVar4;
      bVar2 = callback_awaitor_base<bool,_coro_io::callback_awaitor<bool>_>::
              callback_awaitor_impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/press_tool/../include/cinatra/ylt/coro_io/coro_io.hpp:295:45)>
              ::await_ready(this_00);
      if (bVar2) {
        callback_awaitor_base<bool,_coro_io::callback_awaitor<bool>_>::
        callback_awaitor_impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/press_tool/../include/cinatra/ylt/coro_io/coro_io.hpp:295:45)>
        ::await_resume(this_00);
        async_simple::coro::detail::LazyPromise<bool>::return_value<bool>
                  ((LazyPromise<bool> *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (bool *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        uVar5 = 3;
        uVar7 = 3;
        uVar6 = uVar7;
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar3 + 2));
        bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar3 + 0x7a));
        if (bVar2) {
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar3 + 0x7a));
          async_simple::coro::detail::LazyPromise<bool>::~LazyPromise((LazyPromise<bool> *)0x164230)
          ;
          if (puVar3 != (undefined8 *)0x0) {
            operator_delete(puVar3,0x80);
          }
        }
        else {
          *puVar3 = 0;
          async_await((void *)CONCAT44(uVar6,uVar5),
                      (void *)CONCAT44(uVar7,in_stack_fffffffffffffea8));
          (*(code *)*extraout_RAX)(extraout_RAX);
        }
      }
      else {
        *(undefined1 *)(puVar3 + 0xf) = 1;
        async_await((void *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                    (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      }
    }
    else {
      *(undefined1 *)(puVar3 + 0xf) = 0;
      async_await((void *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
  }
  return (Lazy<bool>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<bool> async_await() noexcept {
    callback_awaitor<bool> awaitor;

    co_return co_await awaitor.await_resume([&](auto handler) {
      this->async_wait([&, handler](const auto &ec) {
        handler.set_value_then_resume(!ec);
      });
    });
  }